

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O3

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callLSetup,void *mem)

{
  long *plVar1;
  N_Vector x;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  
  auVar7._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar7._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar7._8_4_ = -(uint)(ycor == (N_Vector)0x0);
  auVar7._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar3 = movmskps((int)w,auVar7);
  iVar2 = -0x385;
  if (iVar3 == 0 && mem != (void *)0x0) {
    puVar4 = (undefined8 *)NLS->content;
    if (((((code *)*puVar4 != (code *)0x0) && (puVar4[2] != 0)) &&
        ((bVar6 = callLSetup == 0, bVar6 || (puVar4[1] != 0)))) && (puVar4[3] != 0)) {
      x = (N_Vector)puVar4[4];
      puVar4[7] = 0;
      puVar4[8] = 0;
      iVar2 = (*(code *)*puVar4)(ycor,x,mem);
      if (iVar2 == 0) {
        uVar5 = 0;
        while ((bVar6 || (iVar2 = (**(code **)((long)NLS->content + 8))
                                            (uVar5,(long)NLS->content + 0x28,mem), iVar2 == 0))) {
          *(undefined4 *)((long)NLS->content + 0x2c) = 0;
          do {
            plVar1 = (long *)((long)NLS->content + 0x38);
            *plVar1 = *plVar1 + 1;
            N_VScale(-1.0,x,x);
            iVar2 = (**(code **)((long)NLS->content + 0x10))(x,mem);
            if (iVar2 != 0) break;
            N_VLinearSum(1.0,ycor,1.0,x,ycor);
            iVar2 = (**(code **)((long)NLS->content + 0x18))
                              (SUB84(tol,0),NLS,ycor,x,w,*(undefined8 *)((long)NLS->content + 0x48))
            ;
            if (iVar2 != 0x385) {
              if (iVar2 == 0) {
                *(undefined4 *)((long)NLS->content + 0x28) = 0;
                return 0;
              }
              break;
            }
            puVar4 = (undefined8 *)NLS->content;
            iVar2 = *(int *)((long)puVar4 + 0x2c) + 1;
            *(int *)((long)puVar4 + 0x2c) = iVar2;
            if (*(int *)(puVar4 + 6) <= iVar2) {
              iVar2 = 0x386;
              goto LAB_004eb454;
            }
            iVar2 = (*(code *)*puVar4)(ycor,x,mem);
          } while (iVar2 == 0);
          if (iVar2 < 1) break;
          puVar4 = (undefined8 *)NLS->content;
LAB_004eb454:
          if ((*(int *)(puVar4 + 5) != 0) || (puVar4[1] == 0)) break;
          puVar4[8] = puVar4[8] + 1;
          N_VConst(0.0,ycor);
          iVar2 = (**NLS->content)(ycor,x,mem);
          uVar5 = 1;
          bVar6 = false;
          if (iVar2 != 0) break;
        }
      }
      plVar1 = (long *)((long)NLS->content + 0x40);
      *plVar1 = *plVar1 + 1;
    }
  }
  return iVar2;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             N_Vector y0, N_Vector ycor,
                             N_Vector w, realtype tol,
                             booleantype callLSetup, void* mem)
{
  /* local variables */
  int retval;
  booleantype jbad;
  N_Vector delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (NEWTON_CONTENT(NLS)->Sys    == NULL) ||
       (NEWTON_CONTENT(NLS)->LSolve == NULL) ||
       (callLSetup && (NEWTON_CONTENT(NLS)->LSetup == NULL)) ||
       (NEWTON_CONTENT(NLS)->CTest  == NULL) ) {
    return(SUN_NLS_MEM_NULL);
  }

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* initialize iteration and convergence fail counters for this solve */
  NEWTON_CONTENT(NLS)->niters     = 0;
  NEWTON_CONTENT(NLS)->nconvfails = 0;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Preform Newton iteraion */
  for(;;) {

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* if indicated, setup the linear system */
    if (callLSetup) {
      retval = NEWTON_CONTENT(NLS)->LSetup(jbad,
                                           &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_NLS_SUCCESS) break;
    }

    /* initialize current iteration counter for this solve attempt */
    NEWTON_CONTENT(NLS)->curiter = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (NEWTON_CONTENT(NLS)->print_level && NEWTON_CONTENT(NLS)->info_file
        && (NEWTON_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(NEWTON_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_NEWTON (nni=%ld):\n",
              (long int) NEWTON_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_Newton", "begin-iteration",
      "iter = %ld, nni = %ld", (long int) 0, NEWTON_CONTENT(NLS)->niters);
#endif

    /* looping point for Newton iteration. Break out on any error. */
    for(;;) {

      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

      /* update the Newton iterate */
      N_VLinearSum(ONE, ycor, ONE, delta, ycor);

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                          NEWTON_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
      /* print current iteration number and the nonlinear residual */
      if (NEWTON_CONTENT(NLS)->print_level && NEWTON_CONTENT(NLS)->info_file
          && (NEWTON_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
      {
        fprintf(NEWTON_CONTENT(NLS)->info_file,
                "SUNNONLINSOL_NEWTON (nni=%ld):\n",
                (long int) NEWTON_CONTENT(NLS)->niters);
      }
      SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
        "SUNNonlinSolSolve_Newton", "end-of-iterate",
        "iter = %ld, nni = %ld, wrmsnorm = %.16g", NEWTON_CONTENT(NLS)->curiter,
        NEWTON_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

      /* if successful update Jacobian status and return */
      if (retval == SUN_NLS_SUCCESS) {
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return(SUN_NLS_SUCCESS);
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) break;

      /* not yet converged. Increment curiter and test for max allowed. */
      NEWTON_CONTENT(NLS)->curiter++;
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters) {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(ycor, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count,
       reset the initial correction to zero, and loop again with a call to
       lsetup in which jbad is TRUE. Otherwise break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) && (NEWTON_CONTENT(NLS)->LSetup)) {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad = SUNTRUE;
      N_VConst(ZERO, ycor);
      continue;
    } else {
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return(retval);
}